

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitStructNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          StructNew *curr)

{
  Expression *curr_00;
  bool bVar1;
  ExpressionList *this_00;
  size_type sVar2;
  ulong uVar3;
  PrecomputingExpressionRunner *pPVar4;
  Expression **ppEVar5;
  Literal *pLVar6;
  HeapType type;
  undefined1 local_150 [8];
  shared_ptr<wasm::GCData> local_148;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  byte local_e9;
  uintptr_t local_e8;
  Literal local_e0;
  const_reference local_c8;
  value_type *field;
  undefined1 local_b8 [4];
  Index i;
  Literals data;
  FieldList *fields;
  HeapType heapType;
  Expression *operand;
  Iterator __end3;
  Iterator __begin3;
  ExpressionList *__range3;
  StructNew *local_20;
  StructNew *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  Flow *value;
  
  __range3._4_4_ = 1;
  local_20 = curr;
  curr_local = (StructNew *)this;
  this_local = (ExpressionRunner<wasm::PrecomputingExpressionRunner> *)__return_storage_ptr__;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)60>).super_Expression.
                      type,(BasicType *)((long)&__range3 + 4));
  if (bVar1) {
    this_00 = &local_20->operands;
    join_0x00000010_0x00000000_ =
         ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                   (&this_00->
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
    _operand = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                         (&this_00->
                           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         );
    while( true ) {
      bVar1 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator!=((Iterator *)&__end3.index,(Iterator *)&operand);
      if (!bVar1) {
        handle_unreachable("unreachable but no unreachable child",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x602);
      }
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
                operator*((Iterator *)&__end3.index);
      curr_00 = *ppEVar5;
      pPVar4 = self(this);
      visit(__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)pPVar4,
            curr_00);
      heapType.id._0_1_ = Flow::breaking(__return_storage_ptr__);
      heapType.id._1_3_ = 0;
      if (!heapType.id._0_1_) {
        Flow::~Flow(__return_storage_ptr__);
      }
      if ((uint)heapType.id != 0) break;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::operator++
                ((Iterator *)&__end3.index);
    }
  }
  else {
    fields = (FieldList *)
             wasm::Type::getHeapType
                       (&(local_20->super_SpecificExpression<(wasm::Expression::Id)60>).
                         super_Expression.type);
    data.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)HeapType::getStruct((HeapType *)&fields);
    sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                       data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Literals::Literals((Literals *)local_b8,sVar2);
    for (field._4_4_ = 0; uVar3 = (ulong)field._4_4_,
        sVar2 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size
                          ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                           data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage), uVar3 < sVar2;
        field._4_4_ = field._4_4_ + 1) {
      local_c8 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                           ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                            data.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)field._4_4_);
      bVar1 = StructNew::isWithDefault(local_20);
      if (bVar1) {
        local_e8 = (local_c8->type).id;
        wasm::Literal::makeZero(&local_e0,(Type)local_e8);
        pLVar6 = SmallVector<wasm::Literal,_1UL>::operator[]
                           ((SmallVector<wasm::Literal,_1UL> *)local_b8,(ulong)field._4_4_);
        wasm::Literal::operator=(pLVar6,&local_e0);
        wasm::Literal::~Literal(&local_e0);
      }
      else {
        local_e9 = 0;
        pPVar4 = self(this);
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(local_20->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,(ulong)field._4_4_);
        visit(__return_storage_ptr__,(ExpressionRunner<wasm::PrecomputingExpressionRunner> *)pPVar4,
              *ppEVar5);
        bVar1 = Flow::breaking(__return_storage_ptr__);
        if (bVar1) {
          local_e9 = 1;
        }
        else {
          pLVar6 = Flow::getSingleValue(__return_storage_ptr__);
          wasm::Literal::Literal((Literal *)(local_150 + 0x30),pLVar6);
          truncateForPacking(&local_108,this,(Literal *)(local_150 + 0x30),local_c8);
          pLVar6 = SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)local_b8,(ulong)field._4_4_);
          wasm::Literal::operator=(pLVar6,&local_108);
          wasm::Literal::~Literal(&local_108);
          wasm::Literal::~Literal((Literal *)(local_150 + 0x30));
        }
        heapType.id._1_3_ = 0;
        heapType.id._0_1_ = bVar1;
        if ((local_e9 & 1) == 0) {
          Flow::~Flow(__return_storage_ptr__);
        }
        if ((uint)heapType.id != 0) goto LAB_0196e242;
      }
    }
    local_150 = (undefined1  [8])
                wasm::Type::getHeapType
                          (&(local_20->super_SpecificExpression<(wasm::Expression::Id)60>).
                            super_Expression.type);
    std::make_shared<wasm::GCData,wasm::HeapType,wasm::Literals&>
              ((HeapType *)(local_150 + 8),(Literals *)local_150);
    type = wasm::Type::getHeapType
                     (&(local_20->super_SpecificExpression<(wasm::Expression::Id)60>).
                       super_Expression.type);
    wasm::Literal::Literal
              ((Literal *)(local_150 + 0x18),(shared_ptr<wasm::GCData> *)(local_150 + 8),type);
    Flow::Flow(__return_storage_ptr__,(Literal *)(local_150 + 0x18));
    wasm::Literal::~Literal((Literal *)(local_150 + 0x18));
    std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)(local_150 + 8));
    heapType.id._0_4_ = 1;
LAB_0196e242:
    Literals::~Literals((Literals *)local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructNew(StructNew* curr) {
    NOTE_ENTER("StructNew");
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // find why we are unreachable, and stop there.
      for (auto* operand : curr->operands) {
        auto value = self()->visit(operand);
        if (value.breaking()) {
          return value;
        }
      }
      WASM_UNREACHABLE("unreachable but no unreachable child");
    }
    auto heapType = curr->type.getHeapType();
    const auto& fields = heapType.getStruct().fields;
    Literals data(fields.size());
    for (Index i = 0; i < fields.size(); i++) {
      auto& field = fields[i];
      if (curr->isWithDefault()) {
        data[i] = Literal::makeZero(field.type);
      } else {
        auto value = self()->visit(curr->operands[i]);
        if (value.breaking()) {
          return value;
        }
        data[i] = truncateForPacking(value.getSingleValue(), field);
      }
    }
    return Literal(std::make_shared<GCData>(curr->type.getHeapType(), data),
                   curr->type.getHeapType());
  }